

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O3

void R_DrawTiltedPlane(visplane_t *pl,double _xscale,double _yscale,fixed_t alpha,bool additive,
                      bool masked)

{
  float fVar1;
  float fVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  lighttable_t *plVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  double dVar11;
  undefined1 auVar12 [16];
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  double local_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  long lVar16;
  
  if (alpha < 1) {
    return;
  }
  fVar1 = R_DrawTiltedPlane::ifloatpow2[ds_xbits];
  fVar2 = R_DrawTiltedPlane::ifloatpow2[ds_ybits];
  local_a8 = (pl->height).D;
  dStack_a0 = (pl->height).negiC;
  pviewx = SUB84(6755399441055744.0 / (double)(1 << (-(char)ds_xbits & 0x1fU)) +
                 (pl->xform).xScale * (pl->xform).xOffs,0);
  local_98 = 64.0 / ((double)fVar1 * _xscale);
  uStack_90 = 0;
  pviewy = SUB84(6755399441055744.0 / (double)(1 << (-(char)ds_ybits & 0x1fU)) +
                 (pl->xform).yScale * (pl->xform).yOffs,0);
  local_88 = 64.0 / ((double)fVar2 * _yscale);
  uStack_80 = 0;
  dVar11 = ((pl->xform).Angle.Degrees + (pl->xform).baseAngle.Degrees) * 0.017453292519943295;
  dVar14 = ViewAngle.Degrees * 0.017453292519943295;
  sincos(4.71238898038469 - dVar14,&local_38,&local_b0);
  dVar5 = ViewPos.Z;
  local_78 = dStack_a0;
  dStack_70 = dStack_a0;
  fVar9 = (float)(dStack_a0 * local_a8 - ViewPos.Z);
  sincos(3.141592653589793 - (dVar14 + dVar11),&local_50,&local_58);
  local_68 = local_58;
  uStack_60 = 0;
  fVar10 = (float)(-local_98 * local_58);
  sincos(dVar11,&local_40,&local_48);
  auVar4 = _DAT_0073b300;
  dVar14 = (pl->height).normal.X;
  dVar3 = (pl->height).normal.Y;
  dVar11 = (dVar3 * ViewPos.Y + dVar14 * ViewPos.X + local_a8) * dStack_70;
  fVar13 = (float)((dVar3 * (ViewPos.Y + local_48 * local_88) +
                   dVar14 * (local_40 * local_88 + ViewPos.X) + local_a8) * local_78 - dVar11);
  fVar22 = (float)(local_88 * local_50);
  fVar23 = (float)(local_88 * local_68);
  fVar19 = (float)(local_98 * local_50);
  fVar20 = (float)(dVar11 - ((local_98 * local_40 + ViewPos.Y) * dVar3 +
                            local_a8 + (ViewPos.X - local_98 * local_48) * dVar14) * local_78);
  fVar17 = (float)(local_b0 * ViewPos.X - ViewPos.Y * local_38);
  fVar18 = (float)(local_b0 * ViewPos.Y + ViewPos.X * local_38);
  plane_sz.X = fVar13 * fVar10 - fVar20 * fVar22;
  plane_sz.Y = (float)(IYaspectMul * (double)(fVar19 * fVar22 - fVar10 * fVar23));
  plane_sz.Z = (float)(FocalLengthX * (double)(fVar20 * fVar23 - fVar19 * fVar13));
  plane_su.X = (fVar22 * fVar9 - fVar18 * fVar13) * 4.2949673e+09;
  plane_su.Z = (float)((double)(fVar17 * fVar13 - fVar23 * fVar9) * FocalLengthX) * 4.2949673e+09;
  plane_sv.X = (fVar10 * fVar9 - fVar20 * fVar18) * 4.2949673e+09;
  plane_sv.Z = (float)((double)(fVar17 * fVar20 - fVar9 * fVar19) * FocalLengthX) * 4.2949673e+09;
  if (((byte)MirrorFlags & 1) != 0) {
    plane_su.X = -plane_su.X;
    plane_sv.X = -plane_sv.X;
    plane_sz.X = -plane_sz.X;
  }
  plane_sv.Y = (float)((double)(fVar18 * fVar19 - fVar17 * fVar10) * IYaspectMul) * 4.2949673e+09;
  plane_su.Y = (float)((double)(fVar23 * fVar18 - fVar22 * fVar17) * IYaspectMul) * 4.2949673e+09;
  planelightfloat =
       (float)(((double)fVar2 * _yscale * (double)r_TiltVisibility *
               (double)fVar1 * _xscale * 1.52587890625e-05) / ABS(dVar11 - dVar5));
  if (0.0 < (pl->height).normal.Z) {
    planelightfloat = -planelightfloat;
  }
  if ((long)fixedlightlev < 0) {
    plVar6 = fixedcolormap;
    if (fixedcolormap == (lighttable_t *)0x0) {
      ds_colormap = basecolormap->Maps;
      plane_shade = true;
      goto LAB_0030baad;
    }
  }
  else {
    plVar6 = basecolormap->Maps + fixedlightlev;
  }
  plane_shade = false;
  ds_colormap = plVar6;
  if (0 < (long)viewwidth) {
    uVar7 = viewwidth + 1;
    lVar8 = (long)viewwidth + -1;
    auVar12._8_4_ = (int)lVar8;
    auVar12._0_8_ = lVar8;
    auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar12 = auVar12 ^ _DAT_0073b300;
    auVar15 = _DAT_0073b2f0;
    do {
      auVar21 = auVar15 ^ auVar4;
      if ((bool)(~(auVar21._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar21._0_4_ ||
                  auVar12._4_4_ < auVar21._4_4_) & 1)) {
        *(lighttable_t **)((long)tiltlighting + lVar8) = plVar6;
      }
      if ((auVar21._12_4_ != auVar12._12_4_ || auVar21._8_4_ <= auVar12._8_4_) &&
          auVar21._12_4_ <= auVar12._12_4_) {
        *(lighttable_t **)((long)tiltlighting + lVar8 + 8) = plVar6;
      }
      lVar16 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar16 + 2;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uVar7 >> 1) << 4 != lVar8);
  }
LAB_0030baad:
  R_MapVisPlane(pl,R_MapTiltedPlane);
  return;
}

Assistant:

void R_DrawTiltedPlane (visplane_t *pl, double _xscale, double _yscale, fixed_t alpha, bool additive, bool masked)
{
	static const float ifloatpow2[16] =
	{
		// ifloatpow2[i] = 1 / (1 << i)
		64.f, 32.f, 16.f, 8.f, 4.f, 2.f, 1.f, 0.5f,
		0.25f, 0.125f, 0.0625f, 0.03125f, 0.015625f, 0.0078125f,
		0.00390625f, 0.001953125f
		/*, 0.0009765625f, 0.00048828125f, 0.000244140625f,
		1.220703125e-4f, 6.103515625e-5, 3.0517578125e-5*/
	};
	double lxscale, lyscale;
	double xscale, yscale;
	FVector3 p, m, n;
	double ang, planeang, cosine, sine;
	double zeroheight;

	if (alpha <= 0)
	{
		return;
	}

	lxscale = _xscale * ifloatpow2[ds_xbits];
	lyscale = _yscale * ifloatpow2[ds_ybits];
	xscale = 64.f / lxscale;
	yscale = 64.f / lyscale;
	zeroheight = pl->height.ZatPoint(ViewPos);

	pviewx = xs_ToFixed(32 - ds_xbits, pl->xform.xOffs * pl->xform.xScale);
	pviewy = xs_ToFixed(32 - ds_ybits, pl->xform.yOffs * pl->xform.yScale);
	planeang = (pl->xform.Angle + pl->xform.baseAngle).Radians();

	// p is the texture origin in view space
	// Don't add in the offsets at this stage, because doing so can result in
	// errors if the flat is rotated.
	ang = M_PI*3/2 - ViewAngle.Radians();
	cosine = cos(ang), sine = sin(ang);
	p[0] = ViewPos.X * cosine - ViewPos.Y * sine;
	p[2] = ViewPos.X * sine + ViewPos.Y * cosine;
	p[1] = pl->height.ZatPoint(0.0, 0.0) - ViewPos.Z;

	// m is the v direction vector in view space
	ang = ang - M_PI / 2 - planeang;
	cosine = cos(ang), sine = sin(ang);
	m[0] = yscale * cosine;
	m[2] = yscale * sine;
//	m[1] = pl->height.ZatPointF (0, iyscale) - pl->height.ZatPointF (0,0));
//	VectorScale2 (m, 64.f/VectorLength(m));

	// n is the u direction vector in view space
#if 0
	//let's use the sin/cosine we already know instead of computing new ones
	ang += M_PI/2
	n[0] = -xscale * cos(ang);
	n[2] = -xscale * sin(ang);
#else
	n[0] = xscale * sine;
	n[2] = -xscale * cosine;
#endif
//	n[1] = pl->height.ZatPointF (ixscale, 0) - pl->height.ZatPointF (0,0));
//	VectorScale2 (n, 64.f/VectorLength(n));

	// This code keeps the texture coordinates constant across the x,y plane no matter
	// how much you slope the surface. Use the commented-out code above instead to keep
	// the textures a constant size across the surface's plane instead.
	cosine = cos(planeang), sine = sin(planeang);
	m[1] = pl->height.ZatPoint(ViewPos.X + yscale * sine, ViewPos.Y + yscale * cosine) - zeroheight;
	n[1] = -(pl->height.ZatPoint(ViewPos.X - xscale * cosine, ViewPos.Y + xscale * sine) - zeroheight);

	plane_su = p ^ m;
	plane_sv = p ^ n;
	plane_sz = m ^ n;

	plane_su.Z *= FocalLengthX;
	plane_sv.Z *= FocalLengthX;
	plane_sz.Z *= FocalLengthX;

	plane_su.Y *= IYaspectMul;
	plane_sv.Y *= IYaspectMul;
	plane_sz.Y *= IYaspectMul;

	// Premultiply the texture vectors with the scale factors
	plane_su *= 4294967296.f;
	plane_sv *= 4294967296.f;

	if (MirrorFlags & RF_XFLIP)
	{
		plane_su[0] = -plane_su[0];
		plane_sv[0] = -plane_sv[0];
		plane_sz[0] = -plane_sz[0];
	}

	planelightfloat = (r_TiltVisibility * lxscale * lyscale) / (fabs(pl->height.ZatPoint(ViewPos) - ViewPos.Z)) / 65536.f;

	if (pl->height.fC() > 0)
		planelightfloat = -planelightfloat;

	if (fixedlightlev >= 0)
		ds_colormap = basecolormap->Maps + fixedlightlev, plane_shade = false;
	else if (fixedcolormap)
		ds_colormap = fixedcolormap, plane_shade = false;
	else
		ds_colormap = basecolormap->Maps, plane_shade = true;

	if (!plane_shade)
	{
		for (int i = 0; i < viewwidth; ++i)
		{
			tiltlighting[i] = ds_colormap;
		}
	}

#if defined(X86_ASM)
	if (ds_source != ds_curtiltedsource)
		R_SetTiltedSpanSource_ASM (ds_source);
	R_MapVisPlane (pl, R_DrawTiltedPlane_ASM);
#else
	R_MapVisPlane (pl, R_MapTiltedPlane);
#endif
}